

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O3

void gimage::loadViewProperties(Properties *prop,char *name,char *spath,bool verbose)

{
  char *pcVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  pointer pbVar5;
  pointer pbVar6;
  Properties *this;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  ostream *poVar10;
  long *plVar11;
  undefined7 in_register_00000009;
  size_type *psVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  pointer pbVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string s;
  string depthname;
  double t;
  Properties mprop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  undefined4 local_144;
  char *local_140;
  Properties *local_138;
  undefined1 local_130 [32];
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double local_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  char *local_88;
  undefined1 *local_80;
  ulong local_78;
  undefined1 local_70 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_144 = (undefined4)CONCAT71(in_register_00000009,verbose);
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_130,name,(allocator *)&local_60);
  local_138 = prop;
  gutil::split(&local_168,(string *)local_130,',',true);
  pcVar2 = local_130 + 0x10;
  if ((char *)local_130._0_8_ != pcVar2) {
    operator_delete((void *)local_130._0_8_);
  }
  if (0x20 < (ulong)((long)local_168.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_168.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    uVar13 = 1;
    lVar14 = 0x20;
    bVar15 = false;
    local_140 = spath;
    do {
      iVar8 = std::__cxx11::string::compare
                        ((long)&((local_168.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar14,0,(char *)0x2);
      if (iVar8 == 0) {
        std::__cxx11::string::substr
                  ((ulong)local_130,
                   (long)&((local_168.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar14);
        gutil::Properties::load(local_138,(char *)local_130._0_8_);
        if ((char *)local_130._0_8_ != pcVar2) {
          operator_delete((void *)local_130._0_8_);
        }
        bVar15 = true;
      }
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x20;
    } while (uVar13 < (ulong)((long)local_168.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_168.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
    spath = local_140;
    if (bVar15) goto LAB_001369cb;
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar4 = ((local_168.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar4,
             pcVar4 + (local_168.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  pbVar6 = local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar16 = local_168.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pcVar4 = (pbVar16->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &pbVar16->field_2) {
        operator_delete(pcVar4);
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 != pbVar6);
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  }
  getPrefixAlternatives(&local_168,&local_a8,spath);
  uVar9 = (uint)((ulong)((long)local_168.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_168.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar9) {
    local_140 = (char *)(ulong)(uVar9 & 0x7fffffff);
    do {
      pcVar1 = local_140 + -1;
      lVar14 = 0;
      pcVar7 = pcVar1;
      local_88 = local_140;
      do {
        local_140 = pcVar7;
        pcVar4 = local_168.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)pcVar1]._M_dataplus._M_p;
        local_130._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_130,pcVar4,
                   pcVar4 + local_168.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)pcVar1]._M_string_length
                  );
        std::__cxx11::string::append((char *)local_130);
        gutil::Properties::load(local_138,(char *)local_130._0_8_);
        if ((char *)local_130._0_8_ != pcVar2) {
          operator_delete((void *)local_130._0_8_);
        }
        if ((char)local_144 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Using parameter file: ",0x16);
          pcVar4 = local_168.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)pcVar1]._M_dataplus._M_p;
          local_130._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_130,pcVar4,
                     pcVar4 + local_168.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)pcVar1].
                              _M_string_length);
          std::__cxx11::string::append((char *)local_130);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_130._0_8_,local_130._8_8_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if ((char *)local_130._0_8_ != pcVar2) {
            operator_delete((void *)local_130._0_8_);
          }
        }
        lVar14 = lVar14 + 8;
        pcVar7 = local_140;
      } while (lVar14 != 0x20);
    } while (1 < (long)local_88);
  }
  lVar14 = std::__cxx11::string::find_last_of((char *)&local_a8,0x1524f7,0xffffffffffffffff);
  if (8 < local_a8._M_string_length - (lVar14 + 1)) {
    std::__cxx11::string::substr((ulong)local_130,(ulong)&local_a8);
    iVar8 = std::__cxx11::string::compare(local_130);
    if ((char *)local_130._0_8_ != pcVar2) {
      operator_delete((void *)local_130._0_8_);
    }
    if (iVar8 == 0) {
      std::__cxx11::string::substr((ulong)local_130,(ulong)&local_a8);
      plVar11 = (long *)std::__cxx11::string::append(local_130);
      psVar12 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_e8.field_2._M_allocated_capacity = *psVar12;
        local_e8.field_2._8_8_ = plVar11[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar12;
        local_e8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_e8._M_string_length = plVar11[1];
      *plVar11 = (long)psVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((char *)local_130._0_8_ != pcVar2) {
        operator_delete((void *)local_130._0_8_);
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      gutil::Properties::load((Properties *)&local_60,local_e8._M_dataplus._M_p);
      this = local_138;
      if ((char)local_144 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Using Middlebury calibration file: ",0x23);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_e8._M_dataplus._M_p,
                             local_e8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      gutil::Properties::getString((Properties *)&local_60,"width",&local_e8,"0");
      gutil::Properties::putString(this,"camera.width",&local_e8);
      gutil::Properties::getString((Properties *)&local_60,"height",&local_e8,"0");
      gutil::Properties::putString(this,"camera.height",&local_e8);
      local_130._24_8_ = 0;
      local_108 = 0.0;
      dStack_100 = 0.0;
      local_130._8_8_ = 0.0;
      local_130._16_8_ = 0;
      local_f8 = 0.0;
      local_130._0_8_ = (char *)0x3ff0000000000000;
      dStack_110 = 1.0;
      local_f0 = 1.0;
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"cam","");
      plVar11 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_80,local_78,0,'\x01');
      paVar3 = &local_c8.field_2;
      psVar12 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_c8.field_2._M_allocated_capacity = *psVar12;
        local_c8.field_2._8_8_ = plVar11[3];
        local_c8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar12;
        local_c8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_c8._M_string_length = plVar11[1];
      *plVar11 = (long)psVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
                ((Properties *)&local_60,local_c8._M_dataplus._M_p,
                 (SMatrix<double,_3,_3> *)local_130,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar3) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      gutil::Properties::putValue<gmath::SMatrix<double,3,3>>
                (this,"camera.A",(SMatrix<double,_3,_3> *)local_130);
      gutil::Properties::putValue<double>(this,"f",(double *)local_130);
      gutil::Properties::getValue<double>
                ((Properties *)&local_60,"baseline",(double *)&local_80,(char *)0x0);
      gutil::Properties::putValue<double>(this,"t",(double *)&local_80);
      gutil::Properties::getString((Properties *)&local_60,"doffs",&local_e8,"0");
      gutil::Properties::putString(this,"disp.offset",&local_e8);
      local_c8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"[1 0 0; 0 1 0; 0 0 1]","");
      gutil::Properties::putString(this,"camera.R",&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar3) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      local_c8._M_string_length = 0;
      local_c8.field_2._M_allocated_capacity = 0;
      local_c8._M_dataplus._M_p =
           (pointer)((double)(local_a8._M_dataplus._M_p[lVar14 + 5] + -0x30) * (double)local_80);
      gutil::Properties::putValue<gmath::SVector<double,3>>
                (this,"camera.T",(SVector<double,_3> *)&local_c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
LAB_001369cb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  return;
}

Assistant:

void loadViewProperties(gutil::Properties &prop, const char *name, const char *spath,
                        bool verbose)
{
  std::vector<std::string> list;

  // load parameter files as specified in name

  gutil::split(list, name, ',');

  bool expl=false;

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "p=") == 0)
    {
      prop.load(list[i].substr(2).c_str());
      expl=true;
    }
  }

  // alternatively, search for parameter files

  if (!expl)
  {
    std::string depthname=list[0];
    const char *suffix[]= {".txt", ".TXT", "_param.txt", "_PARAM.TXT"};

    list.clear();
    getPrefixAlternatives(list, depthname, spath);

    for (int i=static_cast<int>(list.size())-1; i>=0; i--)
    {
      for (int k=0; k<4; k++)
      {
        // try all possibilities and add parameters

        try
        {
          prop.load((list[i]+suffix[k]).c_str());

          if (verbose)
          {
            std::cout << "Using parameter file: " << list[i]+suffix[k] << std::endl;
          }
        }
        catch (const gutil::Exception &)
        { }
      }
    }

    // support format of Middlebury stereo benchmark data sets

    size_t pos;

    pos=depthname.find_last_of("/\\");

    if (pos == depthname.npos)
    {
      pos=0;
    }
    else
    {
      pos++;
    }

    if (depthname.size()-pos >= 9 && depthname.substr(pos, 4) == "disp")
    {
      try
      {
        std::string s=depthname.substr(0, pos)+"calib.txt";
        gutil::Properties mprop;
        mprop.load(s.c_str());

        if (verbose)
        {
          std::cout << "Using Middlebury calibration file: " << s << std::endl;
        }

        mprop.getString("width", s, "0");
        prop.putString("camera.width", s);
        mprop.getString("height", s, "0");
        prop.putString("camera.height", s);

        gmath::Matrix33d A;
        mprop.getValue((std::string("cam")+depthname[pos+4]).c_str(), A);
        prop.putValue("camera.A", A);

        prop.putValue("f", A(0, 0));

        double t;
        mprop.getValue("baseline", t);
        prop.putValue("t", t);

        mprop.getString("doffs", s, "0");
        prop.putString("disp.offset", s);

        prop.putString("camera.R", "[1 0 0; 0 1 0; 0 0 1]");

        gmath::Vector3d T;
        T[0]=t*(depthname[pos+4]-'0');
        prop.putValue("camera.T", T);
      }
      catch (const gutil::IOException &)
      { }
      catch (const gutil::Exception &ex)
      {
        std::cerr << ex.what() << std::endl;
      }
    }
  }
}